

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_mat * rf_get_camera_matrix2d(rf_camera2d camera)

{
  rf_mat left;
  undefined1 auVar1 [40];
  rf_mat left_00;
  rf_mat left_01;
  rf_mat right;
  rf_mat right_00;
  rf_mat right_01;
  long lVar2;
  long lVar3;
  rf_mat *in_RDI;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000014;
  float in_stack_00000018;
  uint in_stack_0000001c;
  rf_mat result_2;
  rf_mat result;
  rf_mat mat_scale;
  rf_mat mat_rotation;
  long local_128;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  rf_mat local_70;
  
  rf_mat_rotate(&local_70,(rf_vec3)(ZEXT412(0x3f800000) << 0x40),in_stack_00000018 * 0.017453292);
  local_128 = (ulong)in_stack_0000001c << 0x20;
  auVar1 = ZEXT2440(CONCAT816(local_128,ZEXT416(in_stack_0000001c)));
  left.m10 = 1.0;
  left.m14 = 0.0;
  left.m0 = (float)auVar1._0_4_;
  left.m4 = (float)auVar1._4_4_;
  left.m8 = (float)auVar1._8_4_;
  left.m12 = (float)auVar1._12_4_;
  left.m1 = (float)auVar1._16_4_;
  left.m5 = (float)auVar1._20_4_;
  left.m9 = (float)auVar1._24_4_;
  left.m13 = (float)auVar1._28_4_;
  left.m2 = (float)auVar1._32_4_;
  left.m6 = (float)auVar1._36_4_;
  left.m3 = 0.0;
  left.m7 = 0.0;
  left.m11 = 0.0;
  left.m15 = 1.0;
  right.m8 = local_70.m8;
  right.m12 = local_70.m12;
  right.m0 = local_70.m0;
  right.m4 = local_70.m4;
  right.m1 = local_70.m1;
  right.m5 = local_70.m5;
  right.m9 = local_70.m9;
  right.m13 = local_70.m13;
  right.m2 = local_70.m2;
  right.m6 = local_70.m6;
  right.m10 = local_70.m10;
  right.m14 = local_70.m14;
  right.m3 = local_70.m3;
  right.m7 = local_70.m7;
  right.m11 = local_70.m11;
  right.m15 = local_70.m15;
  rf_mat_mul(left,right);
  lVar2 = (ulong)(in_stack_00000010 ^ 0x80000000) << 0x20;
  lVar3 = (ulong)(in_stack_00000014 ^ 0x80000000) << 0x20;
  left_00.m8 = (float)(int)lVar2;
  left_00.m12 = (float)(int)((ulong)lVar2 >> 0x20);
  left_00.m0 = 1.0;
  left_00.m4 = 0.0;
  left_00.m1 = 0.0;
  left_00.m5 = 1.0;
  left_00.m9 = (float)(int)lVar3;
  left_00.m13 = (float)(int)((ulong)lVar3 >> 0x20);
  left_00.m2 = 0.0;
  left_00.m6 = 0.0;
  left_00.m10 = 1.0;
  left_00.m14 = 0.0;
  left_00.m3 = 0.0;
  left_00.m7 = 0.0;
  left_00.m11 = 0.0;
  left_00.m15 = 1.0;
  right_00._8_8_ = uStack_e8;
  right_00._0_8_ = local_f0;
  right_00._16_8_ = local_e0;
  right_00._24_8_ = uStack_d8;
  right_00._32_8_ = local_d0;
  right_00._40_8_ = uStack_c8;
  right_00._48_8_ = local_c0;
  right_00._56_8_ = uStack_b8;
  rf_mat_mul(left_00,right_00);
  left_01._8_8_ = uStack_a8;
  left_01._0_8_ = local_b0;
  left_01._16_8_ = local_a0;
  left_01._24_8_ = uStack_98;
  left_01._32_8_ = local_90;
  left_01._40_8_ = uStack_88;
  left_01._48_8_ = local_80;
  left_01._56_8_ = uStack_78;
  right_01.m8 = (float)(int)((ulong)in_stack_00000008 << 0x20);
  right_01.m12 = (float)(int)(((ulong)in_stack_00000008 << 0x20) >> 0x20);
  right_01.m0 = 1.0;
  right_01.m4 = 0.0;
  right_01.m1 = 0.0;
  right_01.m5 = 1.0;
  right_01.m9 = (float)(int)((ulong)in_stack_0000000c << 0x20);
  right_01.m13 = (float)(int)(((ulong)in_stack_0000000c << 0x20) >> 0x20);
  right_01.m2 = 0.0;
  right_01.m6 = 0.0;
  right_01.m10 = 1.0;
  right_01.m14 = 0.0;
  right_01.m3 = 0.0;
  right_01.m7 = 0.0;
  right_01.m11 = 0.0;
  right_01.m15 = 1.0;
  rf_mat_mul(left_01,right_01);
  return in_RDI;
}

Assistant:

RF_API rf_mat rf_get_camera_matrix2d(rf_camera2d camera)
{
    rf_mat mat_transform = {0};
// The camera in world-space is set by
//   1. Move it to target
//   2. Rotate by -rotation and scale by (1/zoom)
//      When setting higher scale, it's more intuitive for the world to become bigger (= camera become smaller),
//      not for the camera getting bigger, hence the invert. Same deal with rotation.
//   3. Move it by (-offset);
//      Offset defines target transform relative to screen, but since we're effectively "moving" screen (camera)
//      we need to do it into opposite direction (inverse transform)

// Having camera transform in world-space, inverse of it gives the rf_gfxobal_model_view transform.
// Since (A*B*C)' = C'*B'*A', the rf_gfxobal_model_view is
//   1. Move to offset
//   2. Rotate and Scale
//   3. Move by -target
    rf_mat mat_origin = rf_mat_translate(-camera.target.x, -camera.target.y, 0.0f);
    rf_mat mat_rotation = rf_mat_rotate((rf_vec3) {0.0f, 0.0f, 1.0f}, camera.rotation * RF_DEG2RAD);
    rf_mat mat_scale = rf_mat_scale(camera.zoom, camera.zoom, 1.0f);
    rf_mat mat_translation = rf_mat_translate(camera.offset.x, camera.offset.y, 0.0f);

    mat_transform = rf_mat_mul(rf_mat_mul(mat_origin, rf_mat_mul(mat_scale, mat_rotation)), mat_translation);

    return mat_transform;
}